

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O3

void __thiscall flow::IRHandler::~IRHandler(IRHandler *this)

{
  ~IRHandler(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

IRHandler::~IRHandler() {
  for (BasicBlock* bb : basicBlocks()) {
    for (Instr* instr : bb->instructions()) {
      instr->clearOperands();
    }
  }

  while (!blocks_.empty()) {
    auto i = blocks_.begin();
    auto e = blocks_.end();

    while (i != e) {
      BasicBlock* bb = i->get();

      if (bb->predecessors().empty()) {
        i = blocks_.erase(i);
      } else {
        // skip BBs that other BBs still point to (we never point to ourself).
        ++i;
      }
    }
  }
}